

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

bool __thiscall progress::update(progress *this,uint64_t delta,bool force)

{
  unsigned_long *puVar1;
  ulong uVar2;
  void *this_00;
  undefined8 uVar3;
  ostream *poVar4;
  byte in_DL;
  long in_RSI;
  unsigned_long *in_RDI;
  float fVar5;
  double dVar6;
  float rate;
  uint64_t update_interval;
  ptime now;
  uint64_t time;
  float status;
  int in_stack_fffffffffffffe88;
  float in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  string *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  string *this_01;
  float value;
  undefined4 in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffedc;
  float in_stack_fffffffffffffee4;
  float fVar7;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  float local_ec;
  float local_e0;
  float local_d8;
  byte local_d1;
  string local_c8 [32];
  string local_a8 [32];
  print_bytes<float> local_88;
  int local_80;
  char local_79;
  string local_78 [36];
  float local_54;
  undefined8 local_50;
  time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
  local_48;
  base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  local_30;
  ulong local_28;
  float local_20;
  byte local_19;
  bool local_1;
  
  value = (float)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  if (show_progress) {
    local_d1 = 1;
    if ((in_DL & 1) == 0) {
      local_d1 = progress_cleared;
    }
    local_19 = local_d1 & 1;
    in_RDI[1] = in_RSI + in_RDI[1];
    local_20 = 0.0;
    if (*in_RDI != 0) {
      puVar1 = std::min<unsigned_long>(in_RDI + 1,in_RDI);
      local_d8 = (float)*puVar1;
      local_e0 = (float)*in_RDI;
      fVar5 = (local_d8 / local_e0) * 1000.0;
      uVar2 = (ulong)fVar5;
      local_ec = (float)(uVar2 | (long)(fVar5 - 9.223372e+18) & (long)uVar2 >> 0x3f);
      local_20 = local_ec * 0.001;
      if ((local_19 & 1) == 0) {
        if ((local_20 == *(float *)(in_RDI + 4)) && (!NAN(local_20) && !NAN(*(float *)(in_RDI + 4)))
           ) {
          return false;
        }
      }
    }
    local_30.time_.time_count_.value_ =
         (time_rep_type)boost::date_time::microsec_clock<boost::posix_time::ptime>::universal_time()
    ;
    local_48.ticks_.value_ =
         (impl_type)
         boost::date_time::
         base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
         ::operator-((base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                     (time_type *)0x1b8b8c);
    local_28 = boost::date_time::
               time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
               ::total_microseconds
                         ((time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                           *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    local_50 = 50000;
    if (((local_19 & 1) == 0) && (local_28 - in_RDI[5] < 50000)) {
      local_1 = false;
    }
    else {
      in_RDI[5] = local_28;
      *(float *)(in_RDI + 4) = local_20;
      if (*in_RDI == 0) {
        in_stack_fffffffffffffef0 = (float)(long)local_28;
        in_stack_fffffffffffffef4 = (float)local_28;
        dVar6 = std::fmod((double)(ulong)(uint)(in_stack_fffffffffffffef4 * 2e-07),
                          5.30498947741318e-315);
        local_20 = SUB84(dVar6,0);
        if (1.0 < local_20) {
          local_20 = 2.0 - local_20;
        }
      }
      if ((((in_RDI[2] & 1) != 0) && (0x27ff < in_RDI[1])) && (local_28 != 0)) {
        fVar5 = (float)(long)in_RDI[1];
        fVar7 = (float)in_RDI[1];
        in_stack_fffffffffffffedc = fVar7 * 1e+06;
        in_stack_fffffffffffffee4 = (float)local_28;
        local_54 = in_stack_fffffffffffffedc / in_stack_fffffffffffffee4;
        if ((local_54 != *(float *)(in_RDI + 6)) || (NAN(local_54) || NAN(*(float *)(in_RDI + 6))))
        {
          *(float *)(in_RDI + 6) = local_54;
          in_stack_fffffffffffffec8 = (string *)(in_RDI + 7);
          this_01 = local_78;
          std::__cxx11::string::string(this_01);
          value = (float)((ulong)this_01 >> 0x20);
          std::__cxx11::ostringstream::str((string *)in_stack_fffffffffffffec8);
          std::__cxx11::string::~string(local_78);
          this_00 = (void *)std::ostream::operator<<(in_RDI + 7,std::right);
          uVar3 = std::ostream::operator<<(this_00,std::fixed);
          local_79 = (char)std::setfill<char>(' ');
          poVar4 = std::operator<<(uVar3,local_79);
          local_80 = (int)std::setprecision(5);
          std::operator<<(poVar4,(_Setw)local_80);
          local_88 = print_bytes<float>(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88);
          poVar4 = ::detail::operator<<
                             ((ostream *)
                              CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                              (print_bytes<float> *)CONCAT44(fVar7,fVar5));
          std::operator<<(poVar4,"/s");
        }
      }
      if (*in_RDI == 0) {
        std::__cxx11::ostringstream::str();
        show_unbounded(value,in_stack_fffffffffffffec8);
        std::__cxx11::string::~string(local_c8);
      }
      else {
        std::__cxx11::ostringstream::str();
        show(in_stack_fffffffffffffee4,
             (string *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        std::__cxx11::string::~string(local_a8);
      }
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool progress::update(boost::uint64_t delta, bool force) {
	
	if(!show_progress) {
		return false;
	}
	
	force = force || progress_cleared;
	
	value += delta;
	
	float status = 0.f;
	if(max) {
		status = float(std::min(value, max)) / float(max);
		status = float(size_t(1000.f * status)) * (1.f / 1000.f);
		if(!force && status == last_status) {
			return false;
		}
	}
	
	boost::uint64_t time;
	try {
		boost::posix_time::ptime now(boost::posix_time::microsec_clock::universal_time());
		time = boost::uint64_t((now - start_time).total_microseconds());
	} catch(...) {
		// this shouldn't happen, assume no time has passed
		time = last_time;
	}
	
	#if defined(_WIN32)
	const boost::uint64_t update_interval = 100000;
	#else
	const boost::uint64_t update_interval = 50000;
	#endif
	if(!force && time - last_time < update_interval) {
		return false;
	}
	
	last_time = time;
	last_status = status;
	
	if(!max) {
		status = std::fmod(float(time) * (1.f / 5000000.f), 2.f);
		if(status > 1.f) {
			status = 2.f - status;
		}
	}
	
	if(show_rate) {
		if(value >= 10 * 1024 && time > 0) {
			float rate = 1000000.f * float(value) / float(time);
			if(rate != last_rate) {
				last_rate = rate;
				label.str(std::string()); // clear the buffer
				label << std::right << std::fixed << std::setfill(' ') << std::setw(5)
				      << print_bytes(rate, 1) << "/s";
			}
		}
	}
	
	if(max) {
		show(status, label.str());
	} else {
		show_unbounded(status, label.str());
	}
	
	return true;
}